

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Worker.cpp
# Opt level: O0

void __thiscall adios2::query::Worker::Worker(Worker *this,string *queryFile,Engine *adiosEngine)

{
  undefined8 in_RDX;
  string *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Worker_01134f18;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RSI);
  in_RDI[5] = in_RDX;
  in_RDI[6] = 0;
  return;
}

Assistant:

Worker::Worker(const std::string &queryFile, adios2::core::Engine *adiosEngine)
: m_QueryFile(queryFile), m_SourceReader(adiosEngine)
{
}